

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O1

void __thiscall
ipx::Basis::TableauRow(Basis *this,Int jb,IndexedVector *btran,IndexedVector *row,bool ignore_fixed)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  Model *pMVar5;
  pointer pdVar6;
  pointer piVar7;
  pointer piVar8;
  double *pdVar9;
  pointer piVar10;
  pointer piVar11;
  double *pdVar12;
  bool bVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  double dVar21;
  
  iVar2 = this->model_->num_rows_;
  iVar3 = this->model_->num_cols_;
  SolveForUpdate(this,jb,btran);
  bVar13 = IndexedVector::sparse(btran);
  if (bVar13) {
    if ((long)btran->nnz_ < 1) {
      dVar21 = 0.0;
    }
    else {
      piVar4 = (this->model_->AIt_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar17 = 0;
      iVar15 = 0;
      do {
        lVar18 = (long)(btran->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar17];
        iVar15 = (iVar15 + piVar4[lVar18 + 1]) - piVar4[lVar18];
        lVar17 = lVar17 + 1;
      } while (btran->nnz_ != lVar17);
      dVar21 = (double)(iVar15 / 2);
    }
    bVar13 = bVar13 && dVar21 <= (double)iVar3 * 0.1;
  }
  pMVar5 = this->model_;
  if (bVar13 == false) {
    uVar14 = 0xffffffff;
    uVar20 = iVar3 + iVar2;
    if (uVar20 != 0 && SCARRY4(iVar3,iVar2) == (int)uVar20 < 0) {
      piVar4 = (pMVar5->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (pMVar5->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (btran->elements_)._M_data;
      pdVar12 = (row->elements_)._M_data;
      uVar16 = 0;
      do {
        iVar2 = piVar7[uVar16];
        dVar21 = 0.0;
        if (iVar2 == -1 || iVar2 == -2 && !ignore_fixed) {
          piVar8 = (pMVar5->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar2 = piVar8[uVar16];
          lVar17 = (long)iVar2;
          iVar3 = piVar8[uVar16 + 1];
          if (iVar2 < iVar3) {
            do {
              dVar21 = dVar21 + pdVar6[lVar17] * pdVar9[piVar4[lVar17]];
              lVar17 = lVar17 + 1;
            } while (iVar3 != lVar17);
          }
        }
        pdVar12[uVar16] = dVar21;
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar20);
    }
  }
  else {
    piVar4 = (pMVar5->AIt_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (pMVar5->AIt_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (btran->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    IndexedVector::set_to_zero(row);
    piVar8 = (row->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (btran->nnz_ < 1) {
      uVar14 = 0;
    }
    else {
      pdVar9 = (btran->elements_)._M_data;
      piVar10 = (pMVar5->AIt_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar11 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar17 = 0;
      uVar14 = 0;
      do {
        lVar18 = (long)piVar7[lVar17];
        iVar2 = piVar10[lVar18];
        lVar19 = (long)iVar2;
        iVar3 = piVar10[lVar18 + 1];
        if (iVar2 < iVar3) {
          dVar21 = pdVar9[lVar18];
          pdVar12 = (row->elements_)._M_data;
          do {
            iVar2 = piVar4[lVar19];
            iVar15 = piVar11[iVar2];
            if (iVar15 == -1 || iVar15 == -2 && !ignore_fixed) {
              piVar11[iVar2] = iVar15 + -2;
              lVar18 = (long)(int)uVar14;
              uVar14 = uVar14 + 1;
              piVar8[lVar18] = iVar2;
            }
            if (piVar11[iVar2] < -2) {
              pdVar12[iVar2] = pdVar6[lVar19] * dVar21 + pdVar12[iVar2];
            }
            lVar19 = lVar19 + 1;
          } while (iVar3 != lVar19);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < btran->nnz_);
    }
    if (0 < (int)uVar14) {
      piVar4 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar16 = 0;
      do {
        piVar1 = piVar4 + piVar8[uVar16];
        *piVar1 = *piVar1 + 2;
        uVar16 = uVar16 + 1;
      } while (uVar14 != uVar16);
    }
  }
  row->nnz_ = uVar14;
  return;
}

Assistant:

void Basis::TableauRow(Int jb, IndexedVector& btran, IndexedVector& row,
                       bool ignore_fixed) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    assert(IsBasic(jb));
    SolveForUpdate(jb, btran);

    // Estimate if tableau row is sparse.
    bool is_sparse = btran.sparse();
    if (is_sparse) {
        const SparseMatrix& AIt = model_.AIt();
        const Int* bi = btran.pattern();
        Int nz = 0;
        for (Int k = 0; k < btran.nnz(); k++) {
            Int i = bi[k];
            nz += AIt.end(i) - AIt.begin(i);
        }
        nz /= 2;                // guess for overlap
        if (nz > kHypersparseThreshold*n)
            is_sparse = false;
    }

    if (is_sparse) {
        // sparse vector * sparse matrix: accesses A rowwise
        const SparseMatrix& AIt = model_.AIt();
        const Int* Ati = AIt.rowidx();
        const double* Atx = AIt.values();
        const Int* bi = btran.pattern();
        row.set_to_zero();
        Int* row_pattern = row.pattern();
        Int nz = 0;
        for (Int k = 0; k < btran.nnz(); k++) {
            Int i = bi[k];
            double temp = btran[i];
            Int begin = AIt.begin(i);
            Int end = AIt.end(i);
            for (Int p = begin; p < end; p++) {
                Int j = Ati[p];
                if (map2basis_[j] == -1 || (map2basis_[j] == -2 && !ignore_fixed))
                {
                    map2basis_[j] -= 2; // mark column
                    row_pattern[nz++] = j;
                }
                if (map2basis_[j] < -2) // marked column
                    row[j] += temp * Atx[p];
            }
        }
        for (Int k = 0; k < nz; k++) // reset marked
            map2basis_[row_pattern[k]] += 2;
        row.set_nnz(nz);
    } else {
        // dense vector * sparse matrix: accesses A columnwise
        const SparseMatrix& AI = model_.AI();
        const Int* Ai = AI.rowidx();
        const double* Ax = AI.values();
        for (Int j = 0; j < n+m; j++) {
            double result = 0.0;
            if (map2basis_[j] == -1 || (map2basis_[j] == -2 && !ignore_fixed)) {
                Int begin = AI.begin(j);
                Int end = AI.end(j);
                for (Int p = begin; p < end; p++)
                    result += Ax[p] * btran[Ai[p]];
            }
            row[j] = result;
        }
        row.InvalidatePattern();
    }
}